

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

Node __thiscall trieste::detail::Make::make_error(Make *this,Location *loc,string *msg)

{
  NodeDef *pNVar1;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar2;
  Token local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80 [3];
  Location local_68;
  Location local_48;
  
  local_b0.def = (TokenDef *)Error;
  Location::Location(&local_48,(Location *)msg);
  NodeDef::create((NodeDef *)this,&local_b0,&local_48);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pNVar1 = (this->top).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0.def = (TokenDef *)ErrorMsg;
  Location::Location((Location *)(local_98 + 0x10),in_RCX);
  NodeDef::create((NodeDef *)local_98,&local_b0,(Location *)(local_98 + 0x10));
  NodeDef::push_back(pNVar1,(Node *)local_98);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_80);
  pNVar1 = (this->top).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0.def = (TokenDef *)ErrorAst;
  Location::Location(&local_68,(Location *)msg);
  NodeDef::create((NodeDef *)local_a8,&local_b0,&local_68);
  NodeDef::push_back(pNVar1,(Node *)local_a8);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node make_error(Location loc, const std::string& msg)
      {
        auto n = NodeDef::create(Error, loc);
        n->push_back(NodeDef::create(ErrorMsg, msg));
        n->push_back(NodeDef::create(ErrorAst, loc));
        return n;
      }